

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O2

string * rcg::anon_unknown_1::storeImagePNG
                   (string *__return_storage_ptr__,string *name,Image *image,size_t yoffset,
                   size_t height)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  ulong uVar2;
  uint64_t uVar3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar4;
  FILE *pFVar5;
  png_structp ppVar6;
  png_infop ppVar7;
  __jmp_buf_tag *p_Var8;
  uchar *puVar9;
  uint8_t *puVar10;
  undefined8 *puVar11;
  IOException *pIVar12;
  char *__rhs;
  ulong uVar13;
  long lVar14;
  uint8_t *row;
  size_t i;
  ulong uVar15;
  size_t k;
  uint8_t *puVar16;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar17;
  ulong height_00;
  bool bVar18;
  undefined8 in_stack_fffffffffffffe98;
  uint uVar20;
  size_t sVar19;
  allocator local_139;
  png_structp png;
  uchar *local_118;
  size_t local_110;
  png_infop local_108;
  uint64_t local_100;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> rgb_pixel;
  png_infop info;
  long local_c8;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> local_c0;
  FILE *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar20 = (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  _Var1._M_head_impl =
       (image->pixel)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  uVar2 = image->height;
  if (height == 0) {
    height = uVar2;
  }
  if (uVar2 < yoffset) {
    yoffset = uVar2;
  }
  height_00 = uVar2 - yoffset;
  if (height <= uVar2 - yoffset) {
    height_00 = height;
  }
  uVar2 = image->width;
  local_110 = image->xpadding;
  uVar3 = image->pixelformat;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_118 = _Var1._M_head_impl;
  if ((uVar3 != 0x1080001) && (uVar3 != 0x81080001)) {
    if ((uVar3 == 0x1100007) || (uVar3 == 0x11000b8)) {
      std::operator+(&local_70,name,".png");
      ensureNewFileName((string *)&png,&local_70);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
      std::__cxx11::string::~string((string *)&png);
      std::__cxx11::string::~string((string *)&local_70);
      pFVar5 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
      if (pFVar5 != (FILE *)0x0) {
        ppVar6 = (png_structp)png_create_write_struct("1.6.37",0,0);
        png = ppVar6;
        ppVar7 = (png_infop)png_create_info_struct(ppVar6);
        info = ppVar7;
        p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar6,longjmp,200);
        _setjmp(p_Var8);
        png_init_io(ppVar6,pFVar5);
        png_set_IHDR(ppVar6,ppVar7,uVar2 & 0xffffffff,height_00 & 0xffffffff,0x10,0,
                     (ulong)uVar20 << 0x20,0,0);
        png_write_info(ppVar6,ppVar7);
        if (image->bigendian == false) {
          png_set_swap(ppVar6);
        }
        lVar14 = local_110 + uVar2 * 2;
        puVar9 = local_118 + yoffset * lVar14;
        while (bVar18 = height_00 != 0, height_00 = height_00 - 1, bVar18) {
          png_write_row(ppVar6,puVar9);
          puVar9 = puVar9 + lVar14;
        }
        png_write_end(ppVar6,ppVar7);
        fclose(pFVar5);
        png_destroy_write_struct(&png,&info);
        return __return_storage_ptr__;
      }
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      pIVar12 = (IOException *)operator_new(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                     "Cannot store file: ",__return_storage_ptr__);
      IOException::IOException(pIVar12,(string *)&png);
      *puVar11 = pIVar12;
      __cxa_throw(puVar11,&(anonymous_namespace)::IOException*::typeinfo,0);
    }
    local_100 = uVar3;
    if (((uVar3 == 0x20c005a) || (uVar3 == 0x2100032)) || (uVar3 == 0x210003b)) {
      std::operator+(&local_90,name,".png");
      ensureNewFileName((string *)&png,&local_90);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
      std::__cxx11::string::~string((string *)&png);
      std::__cxx11::string::~string((string *)&local_90);
      pFVar5 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
      if (pFVar5 != (FILE *)0x0) {
        ppVar6 = (png_structp)png_create_write_struct("1.6.37",0,0);
        png = ppVar6;
        local_108 = (png_infop)png_create_info_struct(ppVar6);
        info = local_108;
        p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar6,longjmp,200);
        _setjmp(p_Var8);
        png_init_io(ppVar6,pFVar5);
        png_set_IHDR(ppVar6,local_108,uVar2 & 0xffffffff,height_00 & 0xffffffff,8,2,
                     (ulong)uVar20 << 0x20,0,0);
        png_write_info(ppVar6,local_108);
        puVar10 = (uint8_t *)operator_new__(uVar2 * 3);
        if (local_100 == 0x20c005a) {
          uVar13 = (uVar2 >> 2) * 6;
        }
        else {
          uVar13 = uVar2 * 2 & 0xfffffffffffffff8;
        }
        local_c8 = uVar13 + local_110;
        row = _Var1._M_head_impl + yoffset * local_c8;
        local_b8 = pFVar5;
        for (uVar13 = 0; uVar13 != height_00; uVar13 = uVar13 + 1) {
          if (local_100 == 0x20c005a) {
            puVar16 = puVar10;
            for (uVar15 = 0; uVar15 < uVar2; uVar15 = uVar15 + 4) {
              convYCbCr411toQuadRGB(puVar16,row,(int)uVar15);
              puVar16 = puVar16 + 0xc;
            }
          }
          else {
            puVar16 = puVar10;
            for (uVar15 = 0; uVar15 < uVar2; uVar15 = uVar15 + 4) {
              convYCbCr422toQuadRGB(puVar16,row,(int)uVar15);
              puVar16 = puVar16 + 0xc;
            }
          }
          png_write_row(ppVar6,puVar10);
          row = row + local_c8;
        }
        png_write_end(ppVar6,local_108);
        fclose(local_b8);
        png_destroy_write_struct(&png,&info);
        return __return_storage_ptr__;
      }
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      pIVar12 = (IOException *)operator_new(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                     "Cannot store file: ",__return_storage_ptr__);
      IOException::IOException(pIVar12,(string *)&png);
      *puVar11 = pIVar12;
      __cxa_throw(puVar11,&(anonymous_namespace)::IOException*::typeinfo,0);
    }
    if (uVar3 != 0x10800c6) {
      uVar13 = uVar2 * 3;
      rgb_pixel._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           operator_new__(height_00 * uVar13);
      uVar15 = uVar2;
      if (local_100 == 0x2180014) {
        uVar15 = uVar13;
      }
      sVar19 = local_110;
      bVar18 = convertImage((uint8_t *)
                            rgb_pixel._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                            (uint8_t *)0x0,local_118 + (uVar15 + local_110) * yoffset,local_100,
                            uVar2,height_00,local_110);
      uVar4._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           rgb_pixel._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      if (bVar18) {
        std::operator+(&local_b0,name,".png");
        local_c0.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
             (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
             uVar4._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
             _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        ensureNewFileName((string *)&png,&local_b0);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
        std::__cxx11::string::~string((string *)&png);
        std::__cxx11::string::~string((string *)&local_b0);
        pFVar5 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
        if (pFVar5 != (FILE *)0x0) {
          ppVar6 = (png_structp)png_create_write_struct("1.6.37",0,0);
          png = ppVar6;
          ppVar7 = (png_infop)png_create_info_struct(ppVar6);
          info = ppVar7;
          p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar6,longjmp,200);
          _setjmp(p_Var8);
          png_init_io(ppVar6,pFVar5);
          png_set_IHDR(ppVar6,ppVar7,uVar2 & 0xffffffff,height_00 & 0xffffffff,8,2,
                       sVar19 & 0xffffffff00000000,0,0);
          png_write_info(ppVar6,ppVar7);
          tVar17.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
               (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)local_c0;
          while (bVar18 = height_00 != 0, height_00 = height_00 - 1, bVar18) {
            png_write_row(ppVar6,tVar17.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
            tVar17.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
                 ((long)tVar17.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar13);
          }
          png_write_end(ppVar6,ppVar7);
          fclose(pFVar5);
          png_destroy_write_struct(&png,&info);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    (&rgb_pixel);
          return __return_storage_ptr__;
        }
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        pIVar12 = (IOException *)operator_new(0x28);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                       "Cannot store file: ",__return_storage_ptr__);
        IOException::IOException(pIVar12,(string *)&png);
        *puVar11 = pIVar12;
        __cxa_throw(puVar11,&(anonymous_namespace)::IOException*::typeinfo,0);
      }
      pIVar12 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&info,"storeImage(): Unsupported pixel format: ",&local_139);
      __rhs = GetPixelFormatName((PfncFormat)image->pixelformat);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                     __rhs);
      IOException::IOException(pIVar12,(string *)&png);
      __cxa_throw(pIVar12,&(anonymous_namespace)::IOException::typeinfo,IOException::~IOException);
    }
  }
  std::operator+(&local_50,name,".png");
  ensureNewFileName((string *)&png,&local_50);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&png);
  std::__cxx11::string::~string((string *)&png);
  std::__cxx11::string::~string((string *)&local_50);
  pFVar5 = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"wb");
  if (pFVar5 != (FILE *)0x0) {
    ppVar6 = (png_structp)png_create_write_struct("1.6.37",0,0);
    png = ppVar6;
    ppVar7 = (png_infop)png_create_info_struct(ppVar6);
    info = ppVar7;
    p_Var8 = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar6,longjmp,200);
    _setjmp(p_Var8);
    png_init_io(ppVar6,pFVar5);
    png_set_IHDR(ppVar6,ppVar7,uVar2 & 0xffffffff,height_00 & 0xffffffff,8,0,(ulong)uVar20 << 0x20,0
                 ,0);
    png_write_info(ppVar6,ppVar7);
    lVar14 = local_110 + uVar2;
    puVar9 = local_118 + yoffset * lVar14;
    while (bVar18 = height_00 != 0, height_00 = height_00 - 1, bVar18) {
      png_write_row(ppVar6,puVar9);
      puVar9 = puVar9 + lVar14;
    }
    png_write_end(ppVar6,ppVar7);
    fclose(pFVar5);
    png_destroy_write_struct(&png,&info);
    return __return_storage_ptr__;
  }
  puVar11 = (undefined8 *)__cxa_allocate_exception(8);
  pIVar12 = (IOException *)operator_new(0x28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&png,
                 "Cannot store file: ",__return_storage_ptr__);
  IOException::IOException(pIVar12,(string *)&png);
  *puVar11 = pIVar12;
  __cxa_throw(puVar11,&(anonymous_namespace)::IOException*::typeinfo,0);
}

Assistant:

std::string storeImagePNG(const std::string &name, const Image &image, size_t yoffset,
  size_t height)
{
  size_t width=image.getWidth();
  size_t real_height=image.getHeight();

  if (height == 0) height=real_height;

  yoffset=std::min(yoffset, real_height);
  height=std::min(height, real_height-yoffset);

  const unsigned char *p=static_cast<const unsigned char *>(image.getPixels());

  size_t px=image.getXPadding();

  uint64_t format=image.getPixelFormat();
  std::string full_name;

  switch (format)
  {
    case Mono8: // store 8 bit monochrome image
    case Confidence8:
    case Error8:
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_GRAY,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        p+=(width+px)*yoffset;
        for (size_t k=0; k<height; k++)
        {
          png_write_row(png, const_cast<png_bytep>(p));
          p+=width+px;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    case Mono16:
    case Coord3D_C16: // store 16 bit monochrome image
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 16, PNG_COLOR_TYPE_GRAY,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        if (!image.isBigEndian())
        {
          png_set_swap(png);
        }

        p+=(2*width+px)*yoffset;
        for (size_t k=0; k<height; k++)
        {
          png_write_row(png, const_cast<png_bytep>(p));
          p+=2*width+px;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    case YCbCr411_8: // convert and store as color image
    case YCbCr422_8:
    case YUV422_8:
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_RGB,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        uint8_t *tmp=new uint8_t [3*width];

        size_t pstep;
        if (format == YCbCr411_8)
        {
          pstep=(width>>2)*6+px;
        }
        else
        {
          pstep=(width>>2)*8+px;
        }

        p+=pstep*yoffset;
        for (size_t k=0; k<height; k++)
        {
          if (format == YCbCr411_8)
          {
            for (size_t i=0; i<width; i+=4)
            {
              convYCbCr411toQuadRGB(tmp+3*i, p, static_cast<int>(i));
            }
          }
          else
          {
            for (size_t i=0; i<width; i+=4)
            {
              convYCbCr422toQuadRGB(tmp+3*i, p, static_cast<int>(i));
            }
          }

          png_write_row(png, tmp);
          p+=pstep;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    default: // try to store as color image
      {
        std::unique_ptr<uint8_t []> rgb_pixel(new uint8_t [3*width*height]);

        if (format == RGB8)
        {
          p+=(3*width+px)*yoffset;
        }
        else
        {
          p+=(width+px)*yoffset;
        }

        if (convertImage(rgb_pixel.get(), 0, p, format, width, height, px))
        {
          p=rgb_pixel.get();

          // open file and init

          full_name=ensureNewFileName(name+".png");
          FILE *out=fopen(full_name.c_str(), "wb");

          if (!out)
          {
            throw new IOException("Cannot store file: "+full_name);
          }

          png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
          png_infop info=png_create_info_struct(png);
          setjmp(png_jmpbuf(png));

          // write header

          png_init_io(png, out);
          png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_RGB,
            PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
            PNG_FILTER_TYPE_DEFAULT);
          png_write_info(png, info);

          // write image body

          for (size_t k=0; k<height; k++)
          {
            png_write_row(png, const_cast<png_bytep>(p));
            p+=3*width;
          }

          // close file

          png_write_end(png, info);
          fclose(out);
          png_destroy_write_struct(&png, &info);
        }
        else
        {
          throw IOException(std::string("storeImage(): Unsupported pixel format: ")+
            GetPixelFormatName(static_cast<PfncFormat>(image.getPixelFormat())));
        }
      }
      break;
  }

  return full_name;
}